

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  long lVar2;
  typeOfCode type;
  typeOfCode type_00;
  typeOfCode type_01;
  typeOfCode type_02;
  typeOfCode type_03;
  typeOfCode type_04;
  typeOfCode type_05;
  char *this;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  longdouble uniformSize;
  longdouble huffmanSize;
  longdouble shannonSize;
  undefined1 local_688 [8];
  ofstream out;
  undefined1 local_488 [8];
  BMP file;
  
  setlocale(6,"RUS");
  BMP::BMP((BMP *)local_488,"D:\\Git\\INF\\src8.bmp");
  std::ofstream::ofstream(local_688,"D:\\Git\\INF\\output.txt",0x10);
  BMP::writeInfo((BMP *)local_488,(ofstream *)0x0);
  BMP::writeMatrix((BMP *)local_488,(ofstream *)0x0);
  BMP::writeFrequency((BMP *)local_488,(ofstream *)0x0);
  this = "\nEntropy: ";
  poVar1 = std::operator<<((ostream *)&std::cout,"\nEntropy: ");
  BMP::getEntropy((longdouble *)local_488,(BMP *)this);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ST0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  BMP::writeCodesOfMessage((BMP *)local_488,HUFFMAN,(ofstream *)0x0);
  BMP::writeCodesOfMessage((BMP *)local_488,UNIFORM,(ofstream *)0x0);
  BMP::writeCodesOfMessage((BMP *)local_488,SHANNON,(ofstream *)0x0);
  BMP::writeCodesOfSymbols((BMP *)local_488,HUFFMAN,(ofstream *)0x0);
  BMP::writeCodesOfSymbols((BMP *)local_488,UNIFORM,(ofstream *)0x0);
  BMP::writeCodesOfSymbols((BMP *)local_488,SHANNON,(ofstream *)0x0);
  poVar1 = std::operator<<((ostream *)&std::cout,"Size Uniform Codes: ");
  BMP::byteSizeCode((longdouble *)local_488,(BMP *)0x0,type);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ST1);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Size Code Shannon:  ");
  BMP::byteSizeCode((longdouble *)local_488,(BMP *)0x2,type_00);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ST2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Size Code Huffman:  ");
  BMP::byteSizeCode((longdouble *)local_488,(BMP *)0x1,type_01);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ST3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Compression ratio Shannon\'s code: ");
  BMP::byteSizeCode((longdouble *)local_488,(BMP *)0x0,type_02);
  BMP::byteSizeCode((longdouble *)local_488,(BMP *)0x2,type_03);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ST4 / in_ST5);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Compression ratio Huffman\'s code: ");
  BMP::byteSizeCode((longdouble *)local_488,(BMP *)0x0,type_04);
  BMP::byteSizeCode((longdouble *)local_488,(BMP *)0x1,type_05);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ST6 / in_ST7);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  lVar2 = BMP::sizeCode((BMP *)local_488,UNIFORM);
  lVar3 = (longdouble)lVar2;
  lVar2 = BMP::sizeCode((BMP *)local_488,SHANNON);
  lVar4 = (longdouble)lVar2;
  lVar2 = BMP::sizeCode((BMP *)local_488,HUFFMAN);
  lVar5 = (longdouble)lVar2;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,lVar3);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,lVar4);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,lVar5);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"Redundancy Shannon\'s code: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(lVar3 - lVar4) / lVar4);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Redundancy Huffman\'s code: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(lVar3 - lVar5) / lVar5);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::ofstream::~ofstream(local_688);
  BMP::~BMP((BMP *)local_488);
  return 0;
}

Assistant:

int main()
{
    setlocale(LC_ALL, "RUS");
    BMP file( (char *)"D:\\Git\\INF\\src8.bmp" );
    ofstream out("D:\\Git\\INF\\output.txt");
    file.writeInfo();
    file.writeMatrix();
    file.writeFrequency();
    cout << "\nEntropy: " << file.getEntropy() << endl;
    file.writeCodesOfMessage(HUFFMAN);
    file.writeCodesOfMessage(UNIFORM);
    file.writeCodesOfMessage(SHANNON);
    file.writeCodesOfSymbols(HUFFMAN);
    file.writeCodesOfSymbols(UNIFORM);
    file.writeCodesOfSymbols(SHANNON);
    cout << "Size Uniform Codes: " << file.byteSizeCode(UNIFORM)<< endl;
    cout << "Size Code Shannon:  " << file.byteSizeCode(SHANNON)<< endl;
    cout << "Size Code Huffman:  " << file.byteSizeCode(HUFFMAN)<< endl << endl;
	cout << "Compression ratio Shannon's code: " << file.byteSizeCode(UNIFORM) / file.byteSizeCode(SHANNON) << endl;
	cout << "Compression ratio Huffman's code: " << file.byteSizeCode(UNIFORM) / file.byteSizeCode(HUFFMAN) << endl;
    long double shannonSize, huffmanSize, uniformSize;
    uniformSize = file.sizeCode(UNIFORM);
    shannonSize = file.sizeCode(SHANNON);
    huffmanSize = file.sizeCode(HUFFMAN);
    cout << uniformSize << ' ' << shannonSize << ' ' << huffmanSize << '\n';
    cout << "Redundancy Shannon's code: " << (uniformSize-shannonSize)/shannonSize << endl;
    cout << "Redundancy Huffman's code: " << (uniformSize-huffmanSize)/huffmanSize << endl;
    out.close();
    //system("pause>>null");
    return 0;
}